

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

bool math::wide_integer::uintwide_t<24u,unsigned_char,void,false>::
     eval_subtract_n<unsigned_char*,unsigned_char_const*,unsigned_char_const*>
               (uchar *r,uchar *u,uchar *v,unsigned_fast_type count,bool has_borrow_in)

{
  uchar uVar1;
  uchar *puVar2;
  unsigned_short local_3a;
  ulong uStack_38;
  local_double_limb_type uv_as_ularge;
  unsigned_fast_type i;
  uint_fast8_t has_borrow_out;
  unsigned_fast_type uStack_28;
  bool has_borrow_in_local;
  unsigned_fast_type count_local;
  uchar *v_local;
  uchar *u_local;
  uchar *r_local;
  
  i._6_1_ = has_borrow_in;
  i._7_1_ = has_borrow_in;
  uStack_28 = count;
  count_local = (unsigned_fast_type)v;
  v_local = u;
  u_local = r;
  for (uStack_38 = 0; uStack_38 < uStack_28; uStack_38 = uStack_38 + 1) {
    local_3a = ((ushort)*v_local - (ushort)*(byte *)count_local) - (ushort)i._6_1_;
    count_local = count_local + 1;
    v_local = v_local + 1;
    uVar1 = detail::make_hi<unsigned_char,unsigned_short>(&local_3a);
    i._6_1_ = uVar1 != '\0';
    uVar1 = (uchar)local_3a;
    puVar2 = detail::advance_and_point<unsigned_char*,long>(u_local,uStack_38);
    *puVar2 = uVar1;
  }
  return i._6_1_ != 0;
}

Assistant:

static constexpr auto eval_subtract_n(      ResultIterator     r,
                                                InputIteratorLeft  u,
                                                InputIteratorRight v,
                                          const unsigned_fast_type count,
                                          const bool               has_borrow_in = false) -> bool
    {
      auto has_borrow_out =
        static_cast<std::uint_fast8_t>
        (
          has_borrow_in ? static_cast<std::uint_fast8_t>(UINT8_C(1))
                        : static_cast<std::uint_fast8_t>(UINT8_C(0))
        );

      using local_limb_type = typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type;

      static_assert
      (
           (std::numeric_limits<local_limb_type>::digits == std::numeric_limits<typename detail::iterator_detail::iterator_traits<InputIteratorLeft>::value_type>::digits)
        && (std::numeric_limits<local_limb_type>::digits == std::numeric_limits<typename detail::iterator_detail::iterator_traits<InputIteratorRight>::value_type>::digits),
        "Error: Internals require same widths for left-right-result limb_types at the moment"
      );

      using local_double_limb_type =
        typename detail::uint_type_helper<static_cast<size_t>(std::numeric_limits<local_limb_type>::digits * 2)>::exact_unsigned_type;

      using result_difference_type = typename detail::iterator_detail::iterator_traits<ResultIterator>::difference_type;

      for(auto i = static_cast<unsigned_fast_type>(UINT8_C(0)); i < count; ++i)
      {
        const auto uv_as_ularge =
          static_cast<local_double_limb_type>
          (
              static_cast<local_double_limb_type>(static_cast<local_double_limb_type>(*u++) - *v++)
            - has_borrow_out
          );

        has_borrow_out =
          static_cast<std::uint_fast8_t>
          (
            (detail::make_hi<local_limb_type>(uv_as_ularge) != static_cast<local_limb_type>(UINT8_C(0)))
              ? static_cast<std::uint_fast8_t>(UINT8_C(1))
              : static_cast<std::uint_fast8_t>(UINT8_C(0))
          );

        *detail::advance_and_point(r, static_cast<result_difference_type>(i)) = static_cast<local_limb_type>(uv_as_ularge);
      }

      return (has_borrow_out != static_cast<std::uint_fast8_t>(UINT8_C(0)));
    }